

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O0

int __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge
          (BitMatrixCursor<ZXing::PointT<double>_> *this,int nth,int range,bool backup)

{
  PointT<double> p;
  uint uVar1;
  bool bVar2;
  Value o;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  PointT<double> PVar3;
  Value v;
  Value lv;
  int steps;
  PointT<double> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  PointT<double> in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  Value in_stack_ffffffffffffffa4;
  double in_stack_ffffffffffffffa8;
  double dVar4;
  Value local_1c;
  int local_18;
  byte local_11;
  int local_10;
  int local_c;
  
  local_11 = in_CL & 1;
  local_18 = 0;
  PVar3.x._4_4_ = in_stack_ffffffffffffffa4.v;
  PVar3.x._0_4_ = in_stack_ffffffffffffffa0;
  PVar3.y = in_stack_ffffffffffffffa8;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_1c = testAt<double>((BitMatrixCursor<ZXing::PointT<double>_> *)in_stack_ffffffffffffff90.y,
                            PVar3);
  while( true ) {
    uVar1 = in_stack_ffffffffffffff84 & 0xffffff;
    if ((local_c != 0) &&
       ((local_10 == 0 || (uVar1 = in_stack_ffffffffffffff84 & 0xffffff, local_18 < local_10)))) {
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
      bVar2 = Value::isValid(&local_1c);
      uVar1 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff84);
    }
    in_stack_ffffffffffffff84 = uVar1;
    if ((char)(in_stack_ffffffffffffff84 >> 0x18) == '\0') break;
    local_18 = local_18 + 1;
    in_stack_ffffffffffffff78 = (PointT<double> *)(in_RDI + 8);
    PVar3 = ZXing::operator*(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
    dVar4 = PVar3.x;
    operator+<double,_double>
              ((PointT<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    p.x._4_4_ = in_stack_ffffffffffffffa4.v;
    p.x._0_4_ = in_stack_ffffffffffffffa0;
    p.y = dVar4;
    o = testAt<double>((BitMatrixCursor<ZXing::PointT<double>_> *)in_stack_ffffffffffffff90.y,p);
    in_stack_ffffffffffffffa4 = o;
    bVar2 = Value::operator!=(&local_1c,o);
    if (bVar2) {
      local_c = local_c + -1;
      local_1c = o;
    }
  }
  if ((local_11 & 1) != 0) {
    local_18 = local_18 + -1;
  }
  ZXing::operator*(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
  PointT<double>::operator+=
            ((PointT<double> *)(in_RDI + 8),(PointT<double> *)&stack0xffffffffffffff90);
  return local_18 * (uint)(local_c == 0);
}

Assistant:

int stepToEdge(int nth = 1, int range = 0, bool backup = false)
	{
		int steps = 0;
		auto lv = testAt(p);

		while (nth && (!range || steps < range) && lv.isValid()) {
			++steps;
			auto v = testAt(p + steps * d);
			if (lv != v) {
				lv = v;
				--nth;
			}
		}
		if (backup)
			--steps;
		p += steps * d;
		return steps * (nth == 0);
	}